

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCVS.cxx
# Opt level: O0

void __thiscall
cmCTestCVS::WriteXMLDirectory(cmCTestCVS *this,cmXMLWriter *xml,string *path,Directory *dir)

{
  PathStatus status;
  Directory *path_00;
  string *psVar1;
  char cVar2;
  bool bVar3;
  pointer ppVar4;
  char *branchFlag_00;
  reference rev;
  reference priorRev;
  undefined1 local_130 [8];
  File f;
  undefined1 local_f8 [8];
  string full;
  _Self local_d0;
  const_iterator fi;
  vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_> revisions;
  string branchFlag;
  string local_88;
  allocator local_51;
  string local_50;
  char *local_30;
  char *slash;
  Directory *dir_local;
  string *path_local;
  cmXMLWriter *xml_local;
  cmCTestCVS *this_local;
  
  slash = (char *)dir;
  dir_local = (Directory *)path;
  path_local = (string *)xml;
  xml_local = (cmXMLWriter *)this;
  cVar2 = std::__cxx11::string::empty();
  psVar1 = path_local;
  local_30 = "/";
  if (cVar2 != '\0') {
    local_30 = "";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"Directory",&local_51);
  cmXMLWriter::StartElement((cmXMLWriter *)psVar1,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  psVar1 = path_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_88,"Name",(allocator *)(branchFlag.field_2._M_local_buf + 0xf));
  cmXMLWriter::Element<std::__cxx11::string>
            ((cmXMLWriter *)psVar1,&local_88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)dir_local);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)(branchFlag.field_2._M_local_buf + 0xf));
  ComputeBranchFlag((string *)
                    &revisions.
                     super__Vector_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,this,(string *)dir_local);
  std::vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::vector
            ((vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_> *)&fi);
  local_d0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::PathStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::PathStatus>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::PathStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::PathStatus>_>_>
                *)slash);
  while( true ) {
    full.field_2._8_8_ =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::PathStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::PathStatus>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::PathStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::PathStatus>_>_>
                *)slash);
    bVar3 = std::operator!=(&local_d0,(_Self *)((long)&full.field_2 + 8));
    if (!bVar3) break;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f.PriorRev,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)dir_local,
                   local_30);
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::PathStatus>_>
             ::operator->(&local_d0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f.PriorRev,
                   &ppVar4->first);
    std::__cxx11::string::~string((string *)&f.PriorRev);
    std::vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::clear
              ((vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_> *)&fi);
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::PathStatus>_>
             ::operator->(&local_d0);
    if (ppVar4->second != PathUpdated) {
      std::vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::push_back
                ((vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_> *)&fi,
                 &(this->super_cmCTestVC).Unknown);
    }
    branchFlag_00 = (char *)std::__cxx11::string::c_str();
    LoadRevisions(this,(string *)local_f8,branchFlag_00,
                  (vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_> *)&fi);
    std::vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::resize
              ((vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_> *)&fi,2,
               &(this->super_cmCTestVC).Unknown);
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::PathStatus>_>
             ::operator->(&local_d0);
    status = ppVar4->second;
    rev = std::vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::operator[]
                    ((vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_> *)&fi,0);
    priorRev = std::vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::operator[]
                         ((vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_> *)&fi,1
                         );
    cmCTestVC::File::File((File *)local_130,status,rev,priorRev);
    psVar1 = path_local;
    path_00 = dir_local;
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::PathStatus>_>
             ::operator->(&local_d0);
    cmCTestVC::WriteXMLEntry
              (&this->super_cmCTestVC,(cmXMLWriter *)psVar1,(string *)path_00,&ppVar4->first,
               (string *)local_f8,(File *)local_130);
    std::__cxx11::string::~string((string *)local_f8);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::PathStatus>_>
    ::operator++(&local_d0);
  }
  cmXMLWriter::EndElement((cmXMLWriter *)path_local);
  std::vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::~vector
            ((vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_> *)&fi);
  std::__cxx11::string::~string
            ((string *)
             &revisions.
              super__Vector_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void cmCTestCVS::WriteXMLDirectory(cmXMLWriter& xml,
                                   std::string const& path,
                                   Directory const& dir)
{
  const char* slash = path.empty()? "":"/";
  xml.StartElement("Directory");
  xml.Element("Name", path);

  // Lookup the branch checked out in the working tree.
  std::string branchFlag = this->ComputeBranchFlag(path);

  // Load revisions and write an entry for each file in this directory.
  std::vector<Revision> revisions;
  for(Directory::const_iterator fi = dir.begin(); fi != dir.end(); ++fi)
    {
    std::string full = path + slash + fi->first;

    // Load two real or unknown revisions.
    revisions.clear();
    if(fi->second != PathUpdated)
      {
      // For local modifications the current rev is unknown and the
      // prior rev is the latest from cvs.
      revisions.push_back(this->Unknown);
      }
    this->LoadRevisions(full, branchFlag.c_str(), revisions);
    revisions.resize(2, this->Unknown);

    // Write the entry for this file with these revisions.
    File f(fi->second, &revisions[0], &revisions[1]);
    this->WriteXMLEntry(xml, path, fi->first, full, f);
    }
  xml.EndElement(); // Directory
}